

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void address_space_unmap_riscv32
               (AddressSpace *as,void *buffer,hwaddr len,_Bool is_write,hwaddr access_len)

{
  uint local_44;
  hwaddr local_40;
  ram_addr_t addr1;
  MemoryRegion_conflict *mr;
  hwaddr access_len_local;
  hwaddr hStack_20;
  _Bool is_write_local;
  hwaddr len_local;
  void *buffer_local;
  AddressSpace *as_local;
  
  mr = (MemoryRegion_conflict *)access_len;
  access_len_local._7_1_ = is_write;
  hStack_20 = len;
  len_local = (hwaddr)buffer;
  buffer_local = as;
  if (buffer == (as->uc->bounce).buffer) {
    if (is_write) {
      address_space_write_riscv32
                (as,(as->uc->bounce).addr,(MemTxAttrs)(local_44 & 0xff800000 | 1),
                 (as->uc->bounce).buffer,access_len);
    }
    qemu_vfree(*(void **)(*(long *)((long)buffer_local + 0x30) + 0x2a8));
    *(undefined8 *)(*(long *)((long)buffer_local + 0x30) + 0x2a8) = 0;
  }
  else {
    addr1 = (ram_addr_t)memory_region_from_host_riscv32(as->uc,buffer,&local_40);
    if ((MemoryRegion_conflict *)addr1 == (MemoryRegion_conflict *)0x0) {
      __assert_fail("mr != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x77d,
                    "void address_space_unmap_riscv32(AddressSpace *, void *, hwaddr, _Bool, hwaddr)"
                   );
    }
    if ((access_len_local._7_1_ & 1) != 0) {
      invalidate_and_set_dirty((MemoryRegion_conflict *)addr1,local_40,(hwaddr)mr);
    }
  }
  return;
}

Assistant:

void address_space_unmap(AddressSpace *as, void *buffer, hwaddr len,
                         bool is_write, hwaddr access_len)
{
    if (buffer != as->uc->bounce.buffer) {
        MemoryRegion *mr;
        ram_addr_t addr1;

        mr = memory_region_from_host(as->uc, buffer, &addr1);
        assert(mr != NULL);
        if (is_write) {
            invalidate_and_set_dirty(mr, addr1, access_len);
        }
        return;
    }
    if (is_write) {
        address_space_write(as, as->uc->bounce.addr, MEMTXATTRS_UNSPECIFIED,
                            as->uc->bounce.buffer, access_len);
    }
    qemu_vfree(as->uc->bounce.buffer);
    as->uc->bounce.buffer = NULL;
}